

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O0

int cm_zlib_gzprintf(gzFile file,char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_1108 [16];
  undefined8 local_10f8;
  undefined8 local_10f0;
  undefined8 local_10e8;
  undefined8 local_10e0;
  undefined8 local_10d8;
  undefined8 local_10c8;
  undefined8 local_10b8;
  undefined8 local_10a8;
  undefined8 local_1098;
  undefined8 local_1088;
  undefined8 local_1078;
  undefined8 local_1068;
  uint local_104c;
  undefined4 local_1048;
  int len;
  va_list va;
  char local_1028 [8];
  char buf [4096];
  char *format_local;
  gzFile file_local;
  
  if (in_AL != '\0') {
    local_10d8 = in_XMM0_Qa;
    local_10c8 = in_XMM1_Qa;
    local_10b8 = in_XMM2_Qa;
    local_10a8 = in_XMM3_Qa;
    local_1098 = in_XMM4_Qa;
    local_1088 = in_XMM5_Qa;
    local_1078 = in_XMM6_Qa;
    local_1068 = in_XMM7_Qa;
  }
  buf[0xff7] = '\0';
  va[0].overflow_arg_area = local_1108;
  va[0]._0_8_ = &stack0x00000008;
  len = 0x30;
  local_1048 = 0x10;
  local_10f8 = in_RDX;
  local_10f0 = in_RCX;
  local_10e8 = in_R8;
  local_10e0 = in_R9;
  local_104c = vsnprintf(local_1028,0x1000,format,&local_1048);
  if ((((int)local_104c < 1) || (0xfff < (int)local_104c)) || (buf[0xff7] != '\0')) {
    file_local._4_4_ = 0;
  }
  else {
    file_local._4_4_ = cm_zlib_gzwrite(file,local_1028,local_104c);
  }
  return file_local._4_4_;
}

Assistant:

int ZEXPORTVA gzprintf (gzFile file, const char *format, /* args */ ...)
{
    char buf[Z_PRINTF_BUFSIZE];
    va_list va;
    int len;

    buf[sizeof(buf) - 1] = 0;
    va_start(va, format);
#ifdef NO_vsnprintf
#  ifdef HAS_vsprintf_void
    (void)vsprintf(buf, format, va);
    va_end(va);
    for (len = 0; len < sizeof(buf); len++)
        if (buf[len] == 0) break;
#  else
    len = vsprintf(buf, format, va);
    va_end(va);
#  endif
#else
#  ifdef HAS_vsnprintf_void
    (void)vsnprintf(buf, sizeof(buf), format, va);
    va_end(va);
    len = strlen(buf);
#  else
    len = vsnprintf(buf, sizeof(buf), format, va);
    va_end(va);
#  endif
#endif
    if (len <= 0 || len >= (int)sizeof(buf) || buf[sizeof(buf) - 1] != 0)
        return 0;
    return gzwrite(file, buf, (unsigned)len);
}